

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Symbol>::moveAppend(QGenericArrayOps<Symbol> *this,Symbol *b,Symbol *e)

{
  qsizetype *pqVar1;
  Symbol *pSVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  Token TVar7;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<Symbol>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<Symbol>).size;
      TVar7 = b->token;
      pSVar2[lVar3].lineNum = b->lineNum;
      pSVar2[lVar3].token = TVar7;
      pDVar4 = (b->lex).d.d;
      (b->lex).d.d = (Data *)0x0;
      pSVar2[lVar3].lex.d.d = pDVar4;
      pcVar5 = (b->lex).d.ptr;
      (b->lex).d.ptr = (char *)0x0;
      pSVar2[lVar3].lex.d.ptr = pcVar5;
      qVar6 = (b->lex).d.size;
      (b->lex).d.size = 0;
      pSVar2[lVar3].lex.d.size = qVar6;
      qVar6 = b->len;
      pSVar2[lVar3].from = b->from;
      (&pSVar2[lVar3].from)[1] = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<Symbol>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }